

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsStoreFS::Write<tcu::Vector<float,4>>
          (BasicAllFormatsStoreFS *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  CallLogWrapper *this_00;
  ShaderImageLoadStoreBase *this_01;
  bool bVar1;
  GLuint GVar2;
  ostream *poVar3;
  TestLog **this_02;
  undefined8 uVar4;
  GLenum e;
  GLenum e_00;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  char *pcVar5;
  ulong uVar6;
  GLuint texture;
  GLuint local_254;
  GLuint m_buffer;
  GLuint local_24c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data;
  string local_228;
  string local_208;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  ShaderImageLoadStoreBase local_1c8 [16];
  ShaderImageLoadStoreBase local_1b8 [16];
  ostringstream os;
  
  this_01 = (ShaderImageLoadStoreBase *)(ulong)internalformat;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar3 = std::operator<<((ostream *)&os,"\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_208,this_01,e);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  pcVar5 = ", binding = 2) writeonly uniform ";
  poVar3 = std::operator<<(poVar3,", binding = 2) writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_228,(ShaderImageLoadStoreBase *)pcVar5);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  pcVar5 = 
  "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
  ;
  poVar3 = std::operator<<(poVar3,
                           "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)&out_data,(ShaderImageLoadStoreBase *)pcVar5);
  poVar3 = std::operator<<(poVar3,(string *)&out_data);
  poVar3 = std::operator<<(poVar3,"vec4");
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,");\n  discard;\n}");
  std::__cxx11::string::~string((string *)&out_data);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  local_254 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                        ((ShaderImageLoadStoreBase *)this,
                         "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                         ,(char *)data.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,false,false);
  std::__cxx11::string::~string((string *)&data);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x79,(allocator_type *)&os);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  glu::CallLogWrapper::glUseProgram(this_00,local_254);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,0xb,0xb);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,0xb,0xb);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,texture,0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  pcVar5 = "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform ";
  poVar3 = std::operator<<(&os.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nuniform "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_208,(ShaderImageLoadStoreBase *)pcVar5);
  poVar3 = std::operator<<(poVar3,(string *)&local_208);
  pcVar5 = "sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ";
  poVar3 = std::operator<<(poVar3,"sampler2D g_sampler;\nlayout(std430) buffer OutputBuffer {\n  ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_228,(ShaderImageLoadStoreBase *)pcVar5);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,
                           "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  data[gl_LocalInvocationIndex] = texelFetch(g_sampler, ivec2(gl_LocalInvocationID), 0);\n  //data[gl_LocalInvocationIndex] = "
                          );
  poVar3 = tcu::operator<<(poVar3,write_value);
  std::operator<<(poVar3,";\n}");
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  GVar2 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                    ((ShaderImageLoadStoreBase *)this,(string *)&out_data,false);
  std::__cxx11::string::~string((string *)&out_data);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&out_data,0x79,(allocator_type *)&os);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,0x790,
             out_data.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,GVar2);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar4 = 0x790;
  this_02 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  uVar6 = 0;
  do {
    if (uVar6 == 0x79) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,local_254);
      glu::CallLogWrapper::glDeleteProgram(this_00,GVar2);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c4dcec:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&out_data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return 0x78 < uVar6;
    }
    bVar1 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this_02,expected_value,(vec4 *)this_01,
                       (GLenum)uVar4);
    if (!bVar1) {
      local_24c = GVar2;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1b8,(Vector<float,_4> *)this_02);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>((string *)&os,local_1b8,v);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1c8,expected_value);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>(&local_208,local_1c8,v_00);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_228,this_01,e_00);
      GVar2 = local_24c;
      glcts::anon_unknown_0::Output
                ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
                 uVar6 & 0xffffffff,
                 os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                 local_208._M_dataplus._M_p,local_228._M_dataplus._M_p,2);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&os);
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,local_254);
      glu::CallLogWrapper::glDeleteProgram(this_00,GVar2);
      glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
      goto LAB_00c4dcec;
    }
    uVar6 = uVar6 + 1;
    this_02 = this_02 + 2;
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint		   program = BuildProgram(src_vs, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 11;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);
		glUseProgram(program);

		GLuint unit = 2;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindTexture(GL_TEXTURE_2D, texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(write_value));
		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteProgram(c_program);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}